

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

void Curl_resolv_unlink(Curl_easy *data,Curl_dns_entry **pdns)

{
  Curl_dns_entry *entry;
  Curl_dns_entry *dns;
  Curl_dns_entry **pdns_local;
  Curl_easy *data_local;
  
  entry = *pdns;
  *pdns = (Curl_dns_entry *)0x0;
  if ((data != (Curl_easy *)0x0) && (data->share != (Curl_share *)0x0)) {
    Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
  }
  hostcache_unlink_entry(entry);
  if ((data != (Curl_easy *)0x0) && (data->share != (Curl_share *)0x0)) {
    Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
  }
  return;
}

Assistant:

void Curl_resolv_unlink(struct Curl_easy *data, struct Curl_dns_entry **pdns)
{
  struct Curl_dns_entry *dns = *pdns;
  *pdns = NULL;
  if(data && data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  hostcache_unlink_entry(dns);

  if(data && data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
}